

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O0

void __thiscall
indigox::Element::Element
          (Element *this,uint8_t Z,string *name,string *symbol,float mass,uint8_t group,
          uint8_t period,uint8_t valence,uint8_t octet,uint8_t hyperOctet,float atomicR,float covR,
          float vdwR,float chi)

{
  string *in_RCX;
  string *in_RDX;
  string in_SIL;
  string *in_RDI;
  string in_R8B;
  string in_R9B;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM4_Da;
  string in_stack_00000008;
  string in_stack_00000010;
  string in_stack_00000018;
  
  std::__cxx11::string::string(in_RDI,in_RDX);
  std::__cxx11::string::string(in_RDI + 0x20,in_RCX);
  in_RDI[0x40] = in_R8B;
  in_RDI[0x41] = in_R9B;
  in_RDI[0x42] = in_SIL;
  in_RDI[0x43] = in_stack_00000008;
  in_RDI[0x44] = in_stack_00000010;
  in_RDI[0x45] = in_stack_00000018;
  *(undefined4 *)(in_RDI + 0x48) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0x4c) = in_XMM1_Da;
  *(undefined4 *)(in_RDI + 0x50) = in_XMM2_Da;
  *(undefined4 *)(in_RDI + 0x54) = in_XMM3_Da;
  *(undefined4 *)(in_RDI + 0x58) = in_XMM4_Da;
  return;
}

Assistant:

Element::Element(uint8_t Z, std::string name, std::string symbol, float mass,
                   uint8_t group, uint8_t period, uint8_t valence,
                   uint8_t octet, uint8_t hyperOctet, float atomicR, float covR,
                   float vdwR, float chi)
  : name_(name), symbol_(symbol), grp_(group), period_(period),Z_(Z),
  val_(valence), oct_(octet), hyper_(hyperOctet), mass_(mass), radius_(atomicR),
  cov_(covR), vdw_(vdwR), chi_(chi) { }